

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::xml_document::reset(xml_document *this,xml_document *proto)

{
  xml_node_struct *pxVar1;
  xml_node xVar2;
  xml_node local_30;
  xml_node local_28;
  
  _destroy(this);
  _create(this);
  pxVar1 = (proto->super_xml_node)._root;
  if (pxVar1 == (xml_node_struct *)0x0) {
    xml_node::xml_node(&local_30);
  }
  else {
    xml_node::xml_node(&local_30,pxVar1->first_child);
  }
  if (local_30._root != (xml_node_struct *)0x0) {
    do {
      xVar2._root = local_30._root;
      xml_node::append_copy(&this->super_xml_node,&local_28);
      xml_node::xml_node(&local_30,(xVar2._root)->next_sibling);
    } while (local_30._root != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

PUGI__FN void xml_document::reset(const xml_document& proto)
	{
		reset();

		for (xml_node cur = proto.first_child(); cur; cur = cur.next_sibling())
			append_copy(cur);
	}